

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O1

void __thiscall FloatingDisplay::layoutWidgets(FloatingDisplay *this,int targetWidth)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = this->baseWindowWidth;
  iVar3 = iVar2 / 2;
  if (iVar2 / 2 <= targetWidth) {
    iVar3 = targetWidth;
  }
  if (SBORROW4(iVar3,iVar2 * 8) == iVar3 + iVar2 * -8 < 0) {
    iVar3 = iVar2 * 8;
  }
  QWidget::resize((QSize *)this->midiMessageLED);
  iVar2 = QFrame::frameWidth();
  lVar1 = *(long *)&(this->midiMessageLED->super_LEDWidget).field_0x20;
  (**(code **)(*(long *)this->lcdWidget + 0x80))
            (this->lcdWidget,
             *(int *)(lVar1 + 0x14) + (iVar3 - (iVar2 * 2 + 4 + *(int *)(lVar1 + 0x1c))) + -5);
  QWidget::resize((QSize *)this->lcdWidget);
  QWidget::move((QPoint *)this->midiMessageLED);
  QWidget::move((QPoint *)this->sizeGrip);
  QWidget::resize((QSize *)this);
  return;
}

Assistant:

void FloatingDisplay::layoutWidgets(int targetWidth) {
	targetWidth = qMin(qMax(targetWidth, baseWindowWidth / 2), 8 * baseWindowWidth);

	qreal scale = targetWidth / qreal(baseWindowWidth);
	midiMessageLED->resize(MIDI_MESSAGE_LED_SIZE * scale);

	int frameWithMargin = frameWidth() + CONTENT_MARGIN;
	int lcdWidth = targetWidth - (midiMessageLED->width() + 2 * frameWithMargin + LAYOUT_SPACING);
	int lcdHeight = lcdWidget->heightForWidth(lcdWidth);
	lcdWidget->resize(lcdWidth, lcdHeight);
	int targetHeight = lcdHeight + 2 * frameWithMargin;

	midiMessageLED->move(frameWithMargin + lcdWidth + LAYOUT_SPACING, frameWithMargin + (lcdHeight - midiMessageLED->height()) / 2);

	sizeGrip->move(targetWidth - SIZE_GRIP_SIZE.width(), targetHeight - SIZE_GRIP_SIZE.height());

	resize(targetWidth, targetHeight);
}